

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_send_message.cpp
# Opt level: O1

void __thiscall BrokerSendMessage_TwoParts_Test::TestBody(BrokerSendMessage_TwoParts_Test *this)

{
  size_type *psVar1;
  bool bVar2;
  uint32_t uVar3;
  char cVar4;
  undefined8 *puVar5;
  Buffer BVar6;
  TypedExpectation<bool_(const_pstore::brokerface::message_type_&)> *pTVar7;
  ActionInterface<bool_(const_pstore::brokerface::message_type_&)> *pAVar8;
  UI_STRING *uis;
  undefined8 uVar9;
  _Manager_type p_Var10;
  UI *ui;
  __string_type __str;
  string verb;
  string path;
  mock_writer wr;
  message_type expected2;
  message_type expected1;
  undefined1 local_360 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  _Any_data local_340;
  _Manager_type local_330 [2];
  bool *local_320;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_318;
  long *local_310;
  long local_308;
  long local_300 [2];
  MatcherBase<const_pstore::brokerface::message_type_&> local_2f0;
  long *local_2d8 [2];
  long local_2c8 [2];
  mock_writer local_2b8;
  undefined1 local_230 [256];
  message_type local_130;
  
  local_310 = local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"verb","");
  cVar4 = (char)local_308;
  local_2d8[0] = local_2c8;
  std::__cxx11::string::_M_construct((ulong)local_2d8,-0xc - cVar4);
  anon_unknown.dwarf_540ba::mock_writer::mock_writer(&local_2b8);
  uVar3 = (this->super_BrokerSendMessage).message_id_;
  local_360._0_8_ = &local_350;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_360,local_310,(long)local_310 + local_308);
  std::__cxx11::string::_M_replace_aux((ulong)local_360,local_360._8_8_,0,'\x01');
  local_340._M_unused._M_object = local_330;
  std::__cxx11::string::_M_construct((ulong)&local_340,-0xd - cVar4);
  uVar9 = (_Manager_type)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._0_8_ != &local_350) {
    uVar9 = local_350._M_allocated_capacity;
  }
  if ((ulong)uVar9 < (_Manager_type)(local_340._8_8_ + local_360._8_8_)) {
    p_Var10 = (_Manager_type)0xf;
    if ((_Manager_type *)local_340._M_unused._0_8_ != local_330) {
      p_Var10 = local_330[0];
    }
    if ((_Manager_type)(local_340._8_8_ + local_360._8_8_) <= p_Var10) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_340,0,(char *)0x0,local_360._0_8_);
      goto LAB_001188a8;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append(local_360,local_340._M_unused._M_member_pointer);
LAB_001188a8:
  local_230._0_8_ = local_230 + 0x10;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    local_230._16_8_ = *psVar1;
    local_230._24_8_ = puVar5[3];
  }
  else {
    local_230._16_8_ = *psVar1;
    local_230._0_8_ = (size_type *)*puVar5;
  }
  local_230._8_8_ = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  pstore::brokerface::message_type::message_type(&local_130,uVar3,0,2,(string *)local_230);
  if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
    operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
  }
  if ((_Manager_type *)local_340._M_unused._0_8_ != local_330) {
    operator_delete(local_340._M_unused._M_object,(ulong)(local_330[0] + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._0_8_ != &local_350) {
    operator_delete((void *)local_360._0_8_,(ulong)(local_350._M_allocated_capacity + 1));
  }
  uVar3 = (this->super_BrokerSendMessage).message_id_;
  local_360._0_8_ = &local_350;
  std::__cxx11::string::_M_construct((ulong)local_360,'\x01');
  pstore::brokerface::message_type::message_type
            ((message_type *)local_230,uVar3,1,2,(string *)local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._0_8_ != &local_350) {
    operator_delete((void *)local_360._0_8_,(ulong)(local_350._M_allocated_capacity + 1));
  }
  local_2f0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00171848;
  local_2f0.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::brokerface::message_type_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::brokerface::message_type_const&>::ValuePolicy<testing::internal::EqMatcher<pstore::brokerface::message_type>,false>>()
       ::kVTable;
  BVar6.ptr = operator_new(0x104);
  ((BVar6.shared)->ref).super___atomic_base<int>._M_i = 1;
  memcpy((void *)(BVar6.i + 4),&local_130,0x100);
  local_2f0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001717d8;
  local_2f0.buffer_.ptr = BVar6.ptr;
  anon_unknown.dwarf_540ba::mock_writer::gmock_write_impl
            ((MockSpec<bool_(const_pstore::brokerface::message_type_&)> *)local_360,&local_2b8,
             (Matcher<const_pstore::brokerface::message_type_&> *)&local_2f0);
  testing::internal::GetWithoutMatchers();
  pTVar7 = testing::internal::MockSpec<bool_(const_pstore::brokerface::message_type_&)>::
           InternalExpectedAt((MockSpec<bool_(const_pstore::brokerface::message_type_&)> *)local_360
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/brokerface/test_send_message.cpp"
                              ,0x51,"wr","write_impl (Eq (expected1))");
  local_320 = (bool *)operator_new(1);
  *local_320 = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_318,local_320);
  pAVar8 = (ActionInterface<bool_(const_pstore::brokerface::message_type_&)> *)operator_new(0x10);
  pAVar8->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00171a28;
  bVar2 = *local_320;
  *(bool *)&pAVar8[1]._vptr_ActionInterface = bVar2;
  *(bool *)((long)&pAVar8[1]._vptr_ActionInterface + 1) = bVar2;
  testing::Action<bool_(const_pstore::brokerface::message_type_&)>::Action
            ((Action<bool_(const_pstore::brokerface::message_type_&)> *)&local_340,pAVar8);
  testing::internal::TypedExpectation<bool_(const_pstore::brokerface::message_type_&)>::WillOnce
            (pTVar7,(Action<bool_(const_pstore::brokerface::message_type_&)> *)&local_340);
  if (local_330[0] != (_Manager_type)0x0) {
    (*local_330[0])(&local_340,&local_340,__destroy_functor);
  }
  if (local_318._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_318._M_pi);
  }
  testing::internal::MatcherBase<const_pstore::brokerface::message_type_&>::~MatcherBase
            ((MatcherBase<const_pstore::brokerface::message_type_&> *)(local_360 + 8));
  testing::internal::MatcherBase<const_pstore::brokerface::message_type_&>::~MatcherBase(&local_2f0)
  ;
  local_2f0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00171848;
  local_2f0.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::brokerface::message_type_const&>::
       GetVTable<testing::internal::MatcherBase<pstore::brokerface::message_type_const&>::ValuePolicy<testing::internal::EqMatcher<pstore::brokerface::message_type>,false>>()
       ::kVTable;
  BVar6.ptr = operator_new(0x104);
  ((BVar6.shared)->ref).super___atomic_base<int>._M_i = 1;
  memcpy((void *)(BVar6.i + 4),local_230,0x100);
  local_2f0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001717d8;
  local_2f0.buffer_.ptr = BVar6.ptr;
  anon_unknown.dwarf_540ba::mock_writer::gmock_write_impl
            ((MockSpec<bool_(const_pstore::brokerface::message_type_&)> *)local_360,&local_2b8,
             (Matcher<const_pstore::brokerface::message_type_&> *)&local_2f0);
  testing::internal::GetWithoutMatchers();
  pTVar7 = testing::internal::MockSpec<bool_(const_pstore::brokerface::message_type_&)>::
           InternalExpectedAt((MockSpec<bool_(const_pstore::brokerface::message_type_&)> *)local_360
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/brokerface/test_send_message.cpp"
                              ,0x52,"wr","write_impl (Eq (expected2))");
  local_320 = (bool *)operator_new(1);
  *local_320 = true;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>(&local_318,local_320);
  pAVar8 = (ActionInterface<bool_(const_pstore::brokerface::message_type_&)> *)operator_new(0x10);
  pAVar8->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00171a28;
  bVar2 = *local_320;
  *(bool *)&pAVar8[1]._vptr_ActionInterface = bVar2;
  *(bool *)((long)&pAVar8[1]._vptr_ActionInterface + 1) = bVar2;
  testing::Action<bool_(const_pstore::brokerface::message_type_&)>::Action
            ((Action<bool_(const_pstore::brokerface::message_type_&)> *)&local_340,pAVar8);
  testing::internal::TypedExpectation<bool_(const_pstore::brokerface::message_type_&)>::WillOnce
            (pTVar7,(Action<bool_(const_pstore::brokerface::message_type_&)> *)&local_340);
  if (local_330[0] != (_Manager_type)0x0) {
    (*local_330[0])(&local_340,&local_340,__destroy_functor);
  }
  if (local_318._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_318._M_pi);
  }
  testing::internal::MatcherBase<const_pstore::brokerface::message_type_&>::~MatcherBase
            ((MatcherBase<const_pstore::brokerface::message_type_&> *)(local_360 + 8));
  testing::internal::MatcherBase<const_pstore::brokerface::message_type_&>::~MatcherBase(&local_2f0)
  ;
  ui = (UI *)0x1;
  pstore::brokerface::send_message
            (&local_2b8.super_writer,true,(czstring)local_310,(czstring)local_2d8[0]);
  local_2b8.super_writer._vptr_writer = (_func_int **)&PTR__mock_writer_00171628;
  testing::internal::FunctionMocker<bool_(const_pstore::brokerface::message_type_&)>::
  ~FunctionMocker(&local_2b8.gmock01_write_impl_36);
  pstore::brokerface::writer::~writer(&local_2b8.super_writer,ui,uis);
  if (local_2d8[0] != local_2c8) {
    operator_delete(local_2d8[0],local_2c8[0] + 1);
  }
  if (local_310 != local_300) {
    operator_delete(local_310,local_300[0] + 1);
  }
  return;
}

Assistant:

TEST_F (BrokerSendMessage, TwoParts) {
    using ::testing::Eq;
    using ::testing::Return;

    std::string const verb = "verb";
    auto const part1_chars = pstore::brokerface::message_type::payload_chars - verb.length () - 1U;

    // Increase the length by 1 to cause the payload to overflow into a second message.
    std::string::size_type const payload_length = part1_chars + 1U;
    std::string const path (payload_length, 'p');

    auto const part2_chars = payload_length - part1_chars;

    mock_writer wr;

    pstore::brokerface::message_type const expected1 (message_id_, 0, 2,
                                                      verb + ' ' + std::string (part1_chars, 'p'));
    pstore::brokerface::message_type const expected2 (message_id_, 1, 2,
                                                      std::string (part2_chars, 'p'));
    EXPECT_CALL (wr, write_impl (Eq (expected1))).WillOnce (Return (true));
    EXPECT_CALL (wr, write_impl (Eq (expected2))).WillOnce (Return (true));

    pstore::brokerface::send_message (wr, true /*error on timeout*/, verb.c_str (), path.c_str ());
}